

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O0

void __thiscall
QtMWidgets::DateTimePickerPrivate::drawSectionItems
          (DateTimePickerPrivate *this,int section,QPainter *p,QStyleOption *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Type TVar4;
  uint uVar5;
  const_reference pSVar6;
  qsizetype qVar7;
  const_reference pQVar8;
  QColor *c;
  QColor QVar9;
  Type local_f8;
  QIncompatibleFlag local_dc;
  QIncompatibleFlag local_d8;
  QIncompatibleFlag local_d4;
  undefined6 local_d0;
  undefined2 uStack_ca;
  undefined6 local_c8;
  undefined2 uStack_c2;
  undefined6 local_c0;
  undefined2 local_ba;
  undefined6 uStack_b8;
  QFlags<Qt::SplitBehaviorFlags> local_a0;
  QLatin1Char local_9b;
  QChar local_9a;
  undefined1 local_98 [8];
  QStringList values;
  QString text;
  QRect r;
  int i_2;
  Type type;
  int textWidth;
  int iterationsCount;
  int i_1;
  int y;
  int index;
  int makePrevIndexCount;
  int yOffset;
  int i;
  int x;
  QStyleOption *opt_local;
  QPainter *p_local;
  int section_local;
  DateTimePickerPrivate *this_local;
  
  yOffset = 0;
  for (makePrevIndexCount = 0; makePrevIndexCount < section;
      makePrevIndexCount = makePrevIndexCount + 1) {
    pSVar6 = QList<QtMWidgets::Section>::at
                       (&(this->super_DateTimeParser).sections,(long)makePrevIndexCount);
    yOffset = pSVar6->sectionWidth + yOffset;
  }
  iVar1 = this->itemSideMargin;
  QPalette::color((QPalette *)(opt + 0x28),WindowText);
  QPainter::setPen((QColor *)p);
  pSVar6 = QList<QtMWidgets::Section>::at(&(this->super_DateTimeParser).sections,(long)section);
  iVar2 = pSVar6->offset;
  y = this->itemsMaxCount / 2;
  if (0 < iVar2) {
    y = y + 1;
  }
  pSVar6 = QList<QtMWidgets::Section>::at(&(this->super_DateTimeParser).sections,(long)section);
  qVar7 = QList<QString>::size(&pSVar6->values);
  if (qVar7 < this->itemsMaxCount) {
    pSVar6 = QList<QtMWidgets::Section>::at(&(this->super_DateTimeParser).sections,(long)section);
    y = pSVar6->currentIndex;
  }
  pSVar6 = QList<QtMWidgets::Section>::at(&(this->super_DateTimeParser).sections,(long)section);
  i_1 = pSVar6->currentIndex;
  iterationsCount = this->currentItemY + iVar2;
  for (textWidth = 0; textWidth < y; textWidth = textWidth + 1) {
    pSVar6 = QList<QtMWidgets::Section>::at(&(this->super_DateTimeParser).sections,(long)section);
    qVar7 = QList<QString>::size(&pSVar6->values);
    i_1 = prevIndex(i_1,(int)qVar7);
    iterationsCount = iterationsCount - (this->itemHeight + this->itemTopMargin);
  }
  if (iVar2 == 0) {
    local_f8 = this->itemsMaxCount;
  }
  else {
    local_f8 = this->itemsMaxCount + AmPmSection;
  }
  type = local_f8;
  pSVar6 = QList<QtMWidgets::Section>::at(&(this->super_DateTimeParser).sections,(long)section);
  qVar7 = QList<QString>::size(&pSVar6->values);
  if (qVar7 < this->itemsMaxCount) {
    pSVar6 = QList<QtMWidgets::Section>::at(&(this->super_DateTimeParser).sections,(long)section);
    qVar7 = QList<QString>::size(&pSVar6->values);
    type = (Type)qVar7;
  }
  pSVar6 = QList<QtMWidgets::Section>::at(&(this->super_DateTimeParser).sections,(long)section);
  iVar2 = pSVar6->sectionWidth;
  iVar3 = this->itemSideMargin;
  pSVar6 = QList<QtMWidgets::Section>::at(&(this->super_DateTimeParser).sections,(long)section);
  TVar4 = pSVar6->type;
  for (r.x2 = 0; r.x2 < (int)type; r.x2 = r.x2 + 1) {
    QRect::QRect((QRect *)((long)&text.d.size + 4),iVar1 + 3 + yOffset,iterationsCount,
                 iVar2 + -6 + iVar3 * -2,this->itemHeight);
    pSVar6 = QList<QtMWidgets::Section>::at(&(this->super_DateTimeParser).sections,(long)section);
    pQVar8 = QList<QString>::at(&pSVar6->values,(long)i_1);
    QString::QString((QString *)&values.d.size,pQVar8);
    if ((TVar4 == DaySectionShort) || (TVar4 == DaySectionLong)) {
      QLatin1Char::QLatin1Char(&local_9b,' ');
      QChar::QChar(&local_9a,local_9b);
      QFlags<Qt::SplitBehaviorFlags>::QFlags(&local_a0,KeepEmptyParts);
      QString::split((QChar *)local_98,(QFlags_conflict1 *)&values.d.size,(uint)(ushort)local_9a.ucs
                    );
      c = QPalette::color((QPalette *)(opt + 0x28),WindowText);
      QVar9 = lighterColor(c,0x4b);
      local_d0 = QVar9._0_6_;
      uStack_ca = QVar9.ct._2_2_;
      local_c8 = QVar9.ct._4_6_;
      uStack_c2 = QVar9._14_2_;
      uStack_b8 = local_c8;
      local_c0 = local_d0;
      local_ba = uStack_ca;
      QPainter::setPen((QColor *)p);
      local_d4 = Qt::operator|(AlignLeading,0x100);
      uVar5 = QIncompatibleFlag::operator_cast_to_int(&local_d4);
      pQVar8 = QList<QString>::at((QList<QString> *)local_98,0);
      QPainter::drawText((QRect *)p,(int)&text + 0x14,(QString *)(ulong)uVar5,(QRect *)pQVar8);
      QPalette::color((QPalette *)(opt + 0x28),WindowText);
      QPainter::setPen((QColor *)p);
      local_d8 = Qt::operator|(AlignRight,0x100);
      uVar5 = QIncompatibleFlag::operator_cast_to_int(&local_d8);
      pQVar8 = QList<QString>::at((QList<QString> *)local_98,1);
      QPainter::drawText((QRect *)p,(int)&text + 0x14,(QString *)(ulong)uVar5,(QRect *)pQVar8);
      QList<QString>::~QList((QList<QString> *)local_98);
    }
    else {
      local_dc = Qt::operator|(AlignLeading,0x100);
      uVar5 = QIncompatibleFlag::operator_cast_to_int(&local_dc);
      QPainter::drawText((QRect *)p,(int)&text + 0x14,(QString *)(ulong)uVar5,
                         (QRect *)&values.d.size);
    }
    pSVar6 = QList<QtMWidgets::Section>::at(&(this->super_DateTimeParser).sections,(long)section);
    qVar7 = QList<QString>::size(&pSVar6->values);
    i_1 = nextIndex(i_1,(int)qVar7);
    iterationsCount = this->itemHeight + this->itemTopMargin + iterationsCount;
    QString::~QString((QString *)&values.d.size);
  }
  return;
}

Assistant:

void
DateTimePickerPrivate::drawSectionItems( int section, QPainter * p,
	const QStyleOption & opt )
{
	int x = 0;

	for( int i = 0; i < section; ++i )
		x += sections.at( i ).sectionWidth;

	x += 3 + itemSideMargin;

	p->setPen( opt.palette.color( QPalette::WindowText ) );

	const int yOffset = sections.at( section ).offset;

	int makePrevIndexCount = itemsMaxCount / 2;

	if( yOffset > 0 )
		++makePrevIndexCount;

	if( sections.at( section ).values.size() < itemsMaxCount )
		makePrevIndexCount = sections.at( section ).currentIndex;

	int index = sections.at( section ).currentIndex;
	int y = currentItemY + yOffset;

	for( int i = 0; i < makePrevIndexCount; ++i )
	{
		index = prevIndex( index, sections.at( section ).values.size() );
		y -= ( itemHeight + itemTopMargin );
	}

	int iterationsCount = ( yOffset == 0 ) ? itemsMaxCount : itemsMaxCount + 1;

	if( sections.at( section ).values.size() < itemsMaxCount )
		iterationsCount = sections.at( section ).values.size();

	const int textWidth = sections.at( section ).sectionWidth - 6 -
		itemSideMargin * 2;

	Section::Type type = sections.at( section ).type;

	for( int i = 0; i < iterationsCount; ++i )
	{
		const QRect r( x, y, textWidth, itemHeight );

		const QString text = sections.at( section ).values.at( index );

		if( type == Section::DaySectionShort ||
			type == Section::DaySectionLong )
		{
			QStringList values = text.split( QLatin1Char( ' ' ) );

			p->setPen(
				lighterColor( opt.palette.color( QPalette::WindowText ), 75 ) );
			p->drawText( r, Qt::AlignLeft | Qt::TextSingleLine, values.at( 0 ) );

			p->setPen( opt.palette.color( QPalette::WindowText ) );
			p->drawText( r, Qt::AlignRight | Qt::TextSingleLine, values.at( 1 ) );
		}
		else
			p->drawText( r, Qt::AlignLeft | Qt::TextSingleLine, text );

		index = nextIndex( index, sections.at( section ).values.size() );
		y += itemHeight + itemTopMargin;
	}
}